

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::NumberParserImpl::parse
          (NumberParserImpl *this,UnicodeString *input,int32_t start,bool greedy,
          ParsedNumber *result,UErrorCode *status)

{
  UBool UVar1;
  NumberParseMatcher **ppNVar2;
  int local_98;
  int32_t i;
  undefined1 local_88 [8];
  StringSegment segment;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  bool greedy_local;
  int32_t start_local;
  UnicodeString *input_local;
  NumberParserImpl *this_local;
  
  segment._80_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    StringSegment::StringSegment
              ((StringSegment *)local_88,input,(bool)((byte)this->fParseFlags & 1));
    StringSegment::adjustOffset((StringSegment *)local_88,start);
    if (greedy) {
      parseGreedyRecursive(this,(StringSegment *)local_88,result,(UErrorCode *)segment._80_8_);
    }
    else {
      parseLongestRecursive(this,(StringSegment *)local_88,result,(UErrorCode *)segment._80_8_);
    }
    for (local_98 = 0; local_98 < this->fNumMatchers; local_98 = local_98 + 1) {
      ppNVar2 = MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_10>::operator[]
                          (&this->fMatchers,(long)local_98);
      (*(*ppNVar2)->_vptr_NumberParseMatcher[5])(*ppNVar2,result);
    }
    ParsedNumber::postProcess(result);
    StringSegment::~StringSegment((StringSegment *)local_88);
  }
  return;
}

Assistant:

void NumberParserImpl::parse(const UnicodeString& input, int32_t start, bool greedy, ParsedNumber& result,
                             UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    U_ASSERT(fFrozen);
    // TODO: Check start >= 0 and start < input.length()
    StringSegment segment(input, 0 != (fParseFlags & PARSE_FLAG_IGNORE_CASE));
    segment.adjustOffset(start);
    if (greedy) {
        parseGreedyRecursive(segment, result, status);
    } else {
        parseLongestRecursive(segment, result, status);
    }
    for (int32_t i = 0; i < fNumMatchers; i++) {
        fMatchers[i]->postProcess(result);
    }
    result.postProcess();
}